

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O1

int CpuFeatures_StringView_ParsePositiveNumber(StringView view)

{
  int iVar1;
  ulong uVar2;
  short *psVar3;
  short *psVar4;
  StringView view_00;
  
  uVar2 = view.size;
  psVar4 = (short *)view.ptr;
  if (uVar2 == 0) {
    return -1;
  }
  if ((uVar2 != 1 && psVar4 != (short *)0x0) && (*psVar4 == 0x7830)) {
    psVar4 = psVar4 + 1;
    if (uVar2 == 1) {
      psVar4 = (short *)0x0;
    }
    psVar3 = (short *)(uVar2 - 2);
    if (uVar2 < 2) {
      psVar3 = (short *)0x0;
    }
    view_00.size = (size_t)psVar3;
    view_00.ptr = (char *)psVar4;
    iVar1 = ParsePositiveNumberWithBase(view_00,0x10);
    return iVar1;
  }
  iVar1 = ParsePositiveNumberWithBase(view,10);
  return iVar1;
}

Assistant:

int CpuFeatures_StringView_ParsePositiveNumber(const StringView view) {
  if (view.size) {
    const StringView hex_prefix = str("0x");
    if (CpuFeatures_StringView_StartsWith(view, hex_prefix)) {
      const StringView span_no_prefix =
          CpuFeatures_StringView_PopFront(view, hex_prefix.size);
      return ParsePositiveNumberWithBase(span_no_prefix, 16);
    }
    return ParsePositiveNumberWithBase(view, 10);
  }
  return -1;
}